

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void duckdb::ReservoirQuantileOperation::
     Operation<long,duckdb::ReservoirQuantileState<long>,duckdb::ReservoirQuantileListOperation<long>>
               (ReservoirQuantileState<long> *state,long *input,AggregateUnaryInput *unary_input)

{
  ReservoirQuantileBindData *this;
  void *pvVar1;
  long in_RDI;
  ReservoirQuantileBindData *bind_data;
  FunctionData *in_stack_ffffffffffffffd0;
  idx_t in_stack_ffffffffffffffd8;
  
  optional_ptr<duckdb::FunctionData,_true>::operator->
            ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffffd0);
  this = FunctionData::Cast<duckdb::ReservoirQuantileBindData>(in_stack_ffffffffffffffd0);
  if (*(long *)(in_RDI + 0x10) == 0) {
    ReservoirQuantileState<long>::Resize
              ((ReservoirQuantileState<long> *)unary_input,(idx_t)bind_data);
  }
  if (*(long *)(in_RDI + 0x18) == 0) {
    pvVar1 = operator_new(0x78);
    BaseReservoirSampling::BaseReservoirSampling((BaseReservoirSampling *)0x1db2ba1);
    *(void **)(in_RDI + 0x18) = pvVar1;
  }
  ReservoirQuantileState<long>::FillReservoir
            ((ReservoirQuantileState<long> *)this,in_stack_ffffffffffffffd8,
             (long)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_data = unary_input.input.bind_data->template Cast<ReservoirQuantileBindData>();
		if (state.pos == 0) {
			state.Resize(bind_data.sample_size);
		}
		if (!state.r_samp) {
			state.r_samp = new BaseReservoirSampling();
		}
		D_ASSERT(state.v);
		state.FillReservoir(bind_data.sample_size, input);
	}